

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O3

void __thiscall
vkt::sr::ShaderRenderCaseInstance::clearImage
          (ShaderRenderCaseInstance *this,Sampler *refSampler,deUint32 mipLevels,
          deUint32 arrayLayers,VkImage destImage)

{
  Handle<(vk::HandleType)24> HVar1;
  DeviceInterface *pDVar2;
  VkDevice pVVar3;
  VkAllocationCallbacks *pVVar4;
  deUint32 queueFamilyIndex;
  VkResult VVar5;
  VkDevice device;
  DeviceInterface *vk;
  VkQueue pVVar6;
  VkImageAspectFlags VVar7;
  VkCommandBuffer local_1c8;
  DeviceInterface *pDStack_1c0;
  VkDevice local_1b8;
  VkAllocationCallbacks *pVStack_1b0;
  Move<vk::Handle<(vk::HandleType)24>_> local_1a8;
  undefined8 local_188;
  deUint64 local_180;
  VkImageAspectFlags local_178;
  undefined4 local_174;
  deUint32 local_170;
  undefined4 local_16c;
  deUint32 local_168;
  CompareMode local_160;
  deUint32 local_15c;
  VkCommandBuffer local_158;
  DeviceInterface *pDStack_150;
  VkDevice local_148;
  VkAllocationCallbacks *pVStack_140;
  undefined8 local_138;
  deUint64 local_130;
  VkImageAspectFlags local_128;
  undefined4 local_124;
  deUint32 local_120;
  undefined4 local_11c;
  deUint32 local_118;
  VkFence local_108;
  Deleter<vk::Handle<(vk::HandleType)6>_> DStack_100;
  VkCommandPool local_e8;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_e0;
  VkImageSubresourceRange clearRange;
  VkClearValue clearValue;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  VkSubmitInfo submitInfo;
  
  local_15c = arrayLayers;
  device = Context::getDevice((this->super_TestInstance).m_context);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar6 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  local_160 = refSampler->compare;
  VVar7 = 2 - (local_160 == COMPAREMODE_NONE);
  DStack_e0.m_device = (VkDevice)0x0;
  DStack_e0.m_allocator = (VkAllocationCallbacks *)0x0;
  local_e8.m_internal = 0;
  DStack_e0.m_deviceIface = (DeviceInterface *)0x0;
  local_1b8 = (VkDevice)0x0;
  pVStack_1b0 = (VkAllocationCallbacks *)0x0;
  local_1c8 = (VkCommandBuffer)0x0;
  pDStack_1c0 = (DeviceInterface *)0x0;
  DStack_100.m_device = (VkDevice)0x0;
  DStack_100.m_allocator = (VkAllocationCallbacks *)0x0;
  local_108.m_internal = 0;
  DStack_100.m_deviceIface = (DeviceInterface *)0x0;
  clearValue._0_4_ = 0.0;
  clearValue._4_4_ = 0;
  clearValue._8_8_ = 0;
  ::vk::createCommandPool(&local_1a8,vk,device,1,queueFamilyIndex,(VkAllocationCallbacks *)0x0);
  pVVar4 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  pVVar3 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  pDVar2 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  HVar1.m_internal =
       local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  local_148 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  pVStack_140 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  local_158 = (VkCommandBuffer)
              local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  pDStack_150 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                m_deviceIface;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_e8.m_internal == 0) {
    DStack_e0.m_device = pVVar3;
    DStack_e0.m_allocator = pVVar4;
    local_e8.m_internal = HVar1.m_internal;
    DStack_e0.m_deviceIface = pDVar2;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_e0,local_e8);
    local_e8.m_internal = (deUint64)local_158;
    DStack_e0.m_deviceIface = pDStack_150;
    DStack_e0.m_device = local_148;
    DStack_e0.m_allocator = pVStack_140;
    if (local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                (&local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
                 (VkCommandPool)
                 local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
    }
  }
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&local_1a8,vk,device,local_e8,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  pVVar4 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  pVVar3 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  pDVar2 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  HVar1.m_internal =
       local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  local_148 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  pVStack_140 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  local_158 = (VkCommandBuffer)
              local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  pDStack_150 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                m_deviceIface;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_1c8 == (VkCommandBuffer)0x0) {
    local_1b8 = pVVar3;
    pVStack_1b0 = pVVar4;
    local_1c8 = (VkCommandBuffer)HVar1.m_internal;
    pDStack_1c0 = pDVar2;
  }
  else {
    submitInfo._0_8_ = local_1c8;
    (**(code **)(*(long *)pDStack_1c0 + 0x240))(pDStack_1c0,local_1b8,pVStack_1b0);
    local_1c8 = local_158;
    pDStack_1c0 = pDStack_150;
    local_1b8 = local_148;
    pVStack_1b0 = pVStack_140;
    if ((VkCommandBuffer)
        local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal !=
        (VkCommandBuffer)0x0) {
      local_158 = (VkCommandBuffer)
                  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
      (*(local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface)->
        _vptr_DeviceInterface[0x48])
                (local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                 m_deviceIface,
                 local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device,
                 local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator
                );
    }
  }
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&local_1a8,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  pVVar4 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  pVVar3 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  pDVar2 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  HVar1.m_internal =
       local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  local_148 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  pVStack_140 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  local_158 = (VkCommandBuffer)
              local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  pDStack_150 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                m_deviceIface;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_108.m_internal == 0) {
    DStack_100.m_device = pVVar3;
    DStack_100.m_allocator = pVVar4;
    local_108.m_internal = HVar1.m_internal;
    DStack_100.m_deviceIface = pDVar2;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()(&DStack_100,local_108);
    local_108.m_internal = (deUint64)local_158;
    DStack_100.m_deviceIface = pDStack_150;
    DStack_100.m_device = local_148;
    DStack_100.m_allocator = pVStack_140;
    if (local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)6>_> *)
                 &local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
                 (VkFence)local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                          m_internal);
    }
  }
  local_158 = (VkCommandBuffer)CONCAT44(local_158._4_4_,0x2d);
  pDStack_150 = (DeviceInterface *)0x0;
  local_148 = (VkDevice)0x100000000000;
  pVStack_140 = (VkAllocationCallbacks *)0x700000000;
  local_138 = 0xffffffffffffffff;
  local_124 = 0;
  local_11c = 0;
  local_118 = local_15c;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal._0_4_ = 0x2d;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)0x2000001000;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x500000007;
  local_188 = 0xffffffffffffffff;
  local_174 = 0;
  local_16c = 0;
  local_168 = local_15c;
  cmdBufferBeginInfo.flags = 1;
  cmdBufferBeginInfo._20_4_ = 0;
  cmdBufferBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  cmdBufferBeginInfo.pNext._0_4_ = 0;
  cmdBufferBeginInfo.pNext._4_4_ = 0;
  clearRange.baseMipLevel = 0;
  clearRange.baseArrayLayer = 0;
  clearRange.layerCount = local_15c;
  local_180 = destImage.m_internal;
  local_178 = VVar7;
  local_170 = mipLevels;
  local_130 = destImage.m_internal;
  local_128 = VVar7;
  local_120 = mipLevels;
  clearRange.aspectMask = VVar7;
  clearRange.levelCount = mipLevels;
  VVar5 = (*vk->_vptr_DeviceInterface[0x49])(vk,local_1c8);
  ::vk::checkResult(VVar5,"vk.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x523);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,local_1c8,0x4000,0x1000,0,0,0,0,0,1,&local_158);
  (*vk->_vptr_DeviceInterface[(ulong)(local_160 != COMPAREMODE_NONE) + 0x66])
            (vk,local_1c8,destImage.m_internal,7,&clearValue,1,&clearRange);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,local_1c8,0x1000,1,0,0,0,0,0,1,&local_1a8);
  VVar5 = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_1c8);
  ::vk::checkResult(VVar5,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x52e);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = &local_1c8;
  VVar5 = (*vk->_vptr_DeviceInterface[2])(vk,pVVar6,1,&submitInfo,local_108.m_internal);
  ::vk::checkResult(VVar5,"vk.queueSubmit(queue, 1, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x53d);
  VVar5 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_108,1,0xffffffffffffffff);
  ::vk::checkResult(VVar5,"vk.waitForFences(vkDevice, 1, &fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x53e);
  if (local_108.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()(&DStack_100,local_108);
  }
  if (local_1c8 != (VkCommandBuffer)0x0) {
    local_158 = local_1c8;
    (*pDStack_1c0->_vptr_DeviceInterface[0x48])(pDStack_1c0,local_1b8,pVStack_1b0,1);
  }
  if (local_e8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_e0,local_e8);
  }
  return;
}

Assistant:

void ShaderRenderCaseInstance::clearImage (const tcu::Sampler&					refSampler,
										   deUint32								mipLevels,
										   deUint32								arrayLayers,
										   VkImage								destImage)
{
	const VkDevice					vkDevice				= m_context.getDevice();
	const DeviceInterface&			vk						= m_context.getDeviceInterface();
	const VkQueue					queue					= m_context.getUniversalQueue();
	const deUint32					queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();

	const bool						isShadowSampler			= refSampler.compare != tcu::Sampler::COMPAREMODE_NONE;
	const VkImageAspectFlags		aspectMask				= isShadowSampler ? VK_IMAGE_ASPECT_DEPTH_BIT : VK_IMAGE_ASPECT_COLOR_BIT;
	Move<VkCommandPool>				cmdPool;
	Move<VkCommandBuffer>			cmdBuffer;
	Move<VkFence>					fence;

	VkClearValue					clearValue;
	deMemset(&clearValue, 0, sizeof(clearValue));


	// Create command pool and buffer
	cmdPool		= createCommandPool(vk, vkDevice, VK_COMMAND_POOL_CREATE_TRANSIENT_BIT, queueFamilyIndex);
	cmdBuffer	= allocateCommandBuffer(vk, vkDevice, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY);

	// Create fence
	fence = createFence(vk, vkDevice);

	const VkImageMemoryBarrier preImageBarrier =
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		0u,												// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		destImage,										// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			aspectMask,								// VkImageAspect	aspect;
			0u,										// deUint32			baseMipLevel;
			mipLevels,								// deUint32			mipLevels;
			0u,										// deUint32			baseArraySlice;
			arrayLayers								// deUint32			arraySize;
		}
	};

	const VkImageMemoryBarrier postImageBarrier =
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			srcAccessMask;
		VK_ACCESS_SHADER_READ_BIT,						// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,		// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		destImage,										// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			aspectMask,								// VkImageAspect	aspect;
			0u,										// deUint32			baseMipLevel;
			mipLevels,								// deUint32			mipLevels;
			0u,										// deUint32			baseArraySlice;
			arrayLayers								// deUint32			arraySize;
		}
	};

	const VkCommandBufferBeginInfo cmdBufferBeginInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType					sType;
		DE_NULL,										// const void*						pNext;
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,	// VkCommandBufferUsageFlags		flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};


	const VkImageSubresourceRange clearRange		=
	{
		aspectMask,										// VkImageAspectFlags	aspectMask;
		0u,												// deUint32				baseMipLevel;
		mipLevels,										// deUint32				levelCount;
		0u,												// deUint32				baseArrayLayer;
		arrayLayers										// deUint32				layerCount;
	};

	// Copy buffer to image
	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo));
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &preImageBarrier);
	if (aspectMask == VK_IMAGE_ASPECT_COLOR_BIT)
	{
		vk.cmdClearColorImage(*cmdBuffer, destImage, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, &clearValue.color, 1, &clearRange);
	}
	else
	{
		vk.cmdClearDepthStencilImage(*cmdBuffer, destImage, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, &clearValue.depthStencil, 1, &clearRange);
	}
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &postImageBarrier);
	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));

	const VkSubmitInfo submitInfo =
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType				sType;
		DE_NULL,						// const void*					pNext;
		0u,								// deUint32						waitSemaphoreCount;
		DE_NULL,						// const VkSemaphore*			pWaitSemaphores;
		DE_NULL,						// const VkPipelineStageFlags*	pWaitDstStageMask;
		1u,								// deUint32						commandBufferCount;
		&cmdBuffer.get(),				// const VkCommandBuffer*		pCommandBuffers;
		0u,								// deUint32						signalSemaphoreCount;
		DE_NULL							// const VkSemaphore*			pSignalSemaphores;
	};

	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), true, ~(0ull) /* infinity */));
}